

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

string * convertUnicodeCharToUtf8_abi_cxx11_(string *__return_storage_ptr__,char32_t character)

{
  byte bVar1;
  char32_t character_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = (byte)character;
  if ((uint)character < 0x80) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,bVar1 & 0x7f);
  }
  else if ((uint)character < 0x800) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(byte)((uint)character >> 6) & 0x1f | 0xc0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,bVar1 & 0x3f | 0x80);
  }
  else {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(byte)((uint)character >> 0xc) & 0xf | 0xe0);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(byte)((uint)character >> 6) & 0x3f | 0x80);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,bVar1 & 0x3f | 0x80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convertUnicodeCharToUtf8(char32_t character)
{
	std::string result;
	
	if (character < 0x80)
	{
		result += character & 0x7F;
	} else if (character < 0x800)
	{
		result += 0xC0 | ((character >> 6) & 0x1F);
		result += (0x80 | (character & 0x3F));
	} else {
		result += 0xE0 | ((character >> 12) & 0xF);
		result += 0x80 | ((character >> 6) & 0x3F);
		result += 0x80 | (character & 0x3F);
	}

	return result;
}